

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManDupConeBackObjs(Gia_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vObjs)

{
  int Var;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  if (pNew->vCis->nSize != vObjs->nSize) {
    __assert_fail("Gia_ManCiNum(pNew) == Vec_IntSize(vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x7ee,"int Gia_ManDupConeBackObjs(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(pNew);
  pNew->pObjs->Value = 0;
  for (iVar3 = 0; iVar3 < pNew->vCis->nSize; iVar3 = iVar3 + 1) {
    pGVar2 = Gia_ManCi(pNew,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    Var = Vec_IntEntry(vObjs,iVar3);
    uVar1 = Abc_Var2Lit(Var,0);
    pGVar2->Value = uVar1;
  }
  pGVar2 = Gia_ManCo(pNew,0);
  Gia_ManDupConeBack_rec(p,pNew,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
  iVar3 = Gia_ObjFanin0Copy(pGVar2);
  return iVar3;
}

Assistant:

int Gia_ManDupConeBackObjs( Gia_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vObjs )
{
    Gia_Obj_t * pObj, * pRoot; int i;
    assert( Gia_ManCiNum(pNew) == Vec_IntSize(vObjs) );
    Gia_ManFillValue(pNew);
    Gia_ManConst0(pNew)->Value = 0;
    Gia_ManForEachCi( pNew, pObj, i )
        pObj->Value = Abc_Var2Lit( Vec_IntEntry(vObjs, i), 0 );
    pRoot = Gia_ManCo(pNew, 0);
    Gia_ManDupConeBack_rec( p, pNew, Gia_ObjFanin0(pRoot) );
    return Gia_ObjFanin0Copy(pRoot);
}